

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O0

void __thiscall Fl_Counter::increment_cb(Fl_Counter *this)

{
  double dVar1;
  double local_18;
  double v;
  Fl_Counter *this_local;
  
  if (this->mouseobj != '\0') {
    local_18 = Fl_Valuator::value(&this->super_Fl_Valuator);
    switch(this->mouseobj) {
    case '\x01':
      local_18 = local_18 - this->lstep_;
      break;
    case '\x02':
      local_18 = Fl_Valuator::increment(&this->super_Fl_Valuator,local_18,-1);
      break;
    case '\x03':
      local_18 = Fl_Valuator::increment(&this->super_Fl_Valuator,local_18,1);
      break;
    case '\x04':
      local_18 = this->lstep_ + local_18;
    }
    dVar1 = Fl_Valuator::round(&this->super_Fl_Valuator,local_18);
    dVar1 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar1);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar1);
  }
  return;
}

Assistant:

void Fl_Counter::increment_cb() {
  if (!mouseobj) return;
  double v = value();
  switch (mouseobj) {
  case 1: v -= lstep_; break;
  case 2: v = increment(v, -1); break;
  case 3: v = increment(v, 1); break;
  case 4: v += lstep_; break;
  }
  handle_drag(clamp(round(v)));
}